

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void qclab::print<float>(complex<float> val)

{
  byte bVar1;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM0_Db;
  complex<float> local_10;
  
  fVar2 = std::abs<float>(&local_10);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    bVar1 = (in_XMM0_Db < 0.0) * '\x02' + 0x2b;
    if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
      if ((in_XMM0_Db != 0.0) || (NAN(in_XMM0_Db))) {
        printf("%10.4f %c %6.4fi",SUB84((double)in_XMM0_Da,0),(double)ABS(in_XMM0_Db),(ulong)bVar1);
      }
      else {
        printf("%10.4f %c      0i",SUB84((double)in_XMM0_Da,0),(ulong)bVar1);
      }
    }
    else {
      printf("         0 %c %6.4fi",SUB84((double)ABS(in_XMM0_Db),0),(ulong)bVar1);
    }
  }
  else {
    printf("                   0");
  }
  return;
}

Assistant:

void print( const std::complex< T > val ) {
    const T real = std::real( val ) ;
    const T imag = std::abs( std::imag( val ) ) ;
    const char sign = std::imag( val ) >= T(0) ? '+' : '-' ;
    if ( std::abs( val ) == T(0) ) {
      std::printf( "                   0" ) ;
    } else if ( std::abs( real ) == T(0) ) {
      std::printf( "         0 %c %6.4fi" , sign , imag ) ;
    } else if ( imag == T(0) ) {
      std::printf( "%10.4f %c      0i" , real , sign ) ;
    } else {
      std::printf( "%10.4f %c %6.4fi" , real , sign , imag ) ;
    }
  }